

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O0

Balance * wallet::GetBalance(CWallet *wallet,int min_depth,bool avoid_reuse)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  reference pvVar5;
  int in_EDX;
  Balance *in_RDI;
  long in_FS_OFFSET;
  CAmount tx_credit_watchonly;
  CAmount tx_credit_mine;
  int tx_depth;
  bool is_trusted;
  CWalletTx *wtx;
  value_type *entry;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *__range2;
  isminefilter reuse_filter;
  const_iterator __end2;
  const_iterator __begin2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> trusted_parents;
  CWalletTx *in_stack_fffffffffffffef8;
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  *in_stack_ffffffffffffff00;
  CWalletTx *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  CWalletTx *in_stack_ffffffffffffff18;
  CWallet *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Balance *trusted_parents_00;
  CWalletTx *in_stack_ffffffffffffff40;
  CWallet *in_stack_ffffffffffffff48;
  isminefilter *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  CWallet *wallet_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  trusted_parents_00 = in_RDI;
  Balance::Balance((Balance *)in_stack_fffffffffffffef8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffef8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)trusted_parents_00,
             (AnnotatedMixin<std::recursive_mutex> *)in_RDI,
             (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (char *)in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffef8
            );
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::begin(in_stack_ffffffffffffff00);
  std::
  unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
  ::end(in_stack_ffffffffffffff00);
  while (bVar2 = _GLOBAL__N_1::std::__detail::operator==
                           ((_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)in_stack_ffffffffffffff08,
                            (_Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                             *)in_stack_ffffffffffffff00), ((bVar2 ^ 0xffU) & 1) != 0) {
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
             operator*((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>
                        *)in_stack_fffffffffffffef8);
    wallet_00 = (CWallet *)&pvVar5->second;
    bVar3 = CachedTxIsTrusted(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                              (set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)
                              trusted_parents_00);
    iVar4 = CWallet::GetTxDepthInMainChain(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff20 =
         (CWallet *)
         CachedTxGetAvailableCredit
                   (wallet_00,(CWalletTx *)CONCAT17(bVar3,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff48 = in_stack_ffffffffffffff20;
    in_stack_ffffffffffffff18 =
         (CWalletTx *)
         CachedTxGetAvailableCredit
                   (wallet_00,(CWalletTx *)CONCAT17(bVar3,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
    if (((bVar3 & 1) != 0) && (in_EDX <= iVar4)) {
      in_RDI->m_mine_trusted =
           (CAmount)((long)&(in_stack_ffffffffffffff48->super_WalletStorage)._vptr_WalletStorage +
                    in_RDI->m_mine_trusted);
      in_RDI->m_watchonly_trusted =
           (long)in_stack_ffffffffffffff18->m_amounts[0].m_value +
           in_RDI->m_watchonly_trusted + -0x70;
    }
    in_stack_ffffffffffffff40 = in_stack_ffffffffffffff18;
    if ((((bVar3 & 1) == 0) && (iVar4 == 0)) &&
       (in_stack_ffffffffffffff17 = CWalletTx::InMempool(in_stack_fffffffffffffef8),
       (bool)in_stack_ffffffffffffff17)) {
      in_RDI->m_mine_untrusted_pending =
           (CAmount)((long)&(in_stack_ffffffffffffff48->super_WalletStorage)._vptr_WalletStorage +
                    in_RDI->m_mine_untrusted_pending);
      in_RDI->m_watchonly_untrusted_pending =
           (long)in_stack_ffffffffffffff40->m_amounts[0].m_value +
           in_RDI->m_watchonly_untrusted_pending + -0x70;
    }
    in_stack_ffffffffffffff08 =
         (CWalletTx *)
         CachedTxGetImmatureCredit
                   ((CWallet *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                    in_stack_ffffffffffffff08,(isminefilter *)in_stack_ffffffffffffff00);
    in_RDI->m_mine_immature =
         (long)in_stack_ffffffffffffff08->m_amounts[0].m_value + in_RDI->m_mine_immature + -0x70;
    in_stack_ffffffffffffff00 =
         (unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          *)CachedTxGetImmatureCredit
                      ((CWallet *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                       in_stack_ffffffffffffff08,(isminefilter *)in_stack_ffffffffffffff00);
    in_RDI->m_watchonly_immature =
         (long)&(in_stack_ffffffffffffff00->_M_h).
                super__Hashtable_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                .
                super__Hash_code_base<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::__detail::_Select1st,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                .super__Hashtable_ebo_helper<1,_SaltedTxidHasher,_false>._M_tp.k0 +
         in_RDI->m_watchonly_immature;
    std::__detail::_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true>::
    operator++((_Node_const_iterator<std::pair<const_uint256,_wallet::CWalletTx>,_false,_true> *)
               in_stack_fffffffffffffef8);
  }
  std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::~set
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)in_stack_fffffffffffffef8
            );
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffef8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return trusted_parents_00;
  }
  __stack_chk_fail();
}

Assistant:

Balance GetBalance(const CWallet& wallet, const int min_depth, bool avoid_reuse)
{
    Balance ret;
    isminefilter reuse_filter = avoid_reuse ? ISMINE_NO : ISMINE_USED;
    {
        LOCK(wallet.cs_wallet);
        std::set<uint256> trusted_parents;
        for (const auto& entry : wallet.mapWallet)
        {
            const CWalletTx& wtx = entry.second;
            const bool is_trusted{CachedTxIsTrusted(wallet, wtx, trusted_parents)};
            const int tx_depth{wallet.GetTxDepthInMainChain(wtx)};
            const CAmount tx_credit_mine{CachedTxGetAvailableCredit(wallet, wtx, ISMINE_SPENDABLE | reuse_filter)};
            const CAmount tx_credit_watchonly{CachedTxGetAvailableCredit(wallet, wtx, ISMINE_WATCH_ONLY | reuse_filter)};
            if (is_trusted && tx_depth >= min_depth) {
                ret.m_mine_trusted += tx_credit_mine;
                ret.m_watchonly_trusted += tx_credit_watchonly;
            }
            if (!is_trusted && tx_depth == 0 && wtx.InMempool()) {
                ret.m_mine_untrusted_pending += tx_credit_mine;
                ret.m_watchonly_untrusted_pending += tx_credit_watchonly;
            }
            ret.m_mine_immature += CachedTxGetImmatureCredit(wallet, wtx, ISMINE_SPENDABLE);
            ret.m_watchonly_immature += CachedTxGetImmatureCredit(wallet, wtx, ISMINE_WATCH_ONLY);
        }
    }
    return ret;
}